

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O3

void __thiscall
fasttext::Dictionary::computeNgrams
          (Dictionary *this,string *word,vector<int,_std::allocator<int>_> *ngrams,
          vector<fasttext::subentry,_std::allocator<fasttext::subentry>_> *subngram,
          subentry *sublemma,
          vector<fasttext::subentry,_std::allocator<fasttext::subentry>_> *submorph,
          vector<fasttext::subentry,_std::allocator<fasttext::subentry>_> *subipangram)

{
  pointer pcVar1;
  iterator iVar2;
  element_type *peVar3;
  int iVar4;
  uint uVar5;
  iterator iVar6;
  undefined8 *puVar7;
  long *plVar8;
  pointer pbVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  size_type *psVar11;
  long lVar12;
  char cVar13;
  size_type sVar14;
  ulong uVar15;
  ulong uVar16;
  pointer pbVar17;
  ulong uVar18;
  ulong uVar19;
  pointer pbVar20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  morphValues;
  subentry e;
  string charn;
  string val;
  string value;
  string prop;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  propsValues;
  undefined1 local_138 [24];
  long lStack_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  long local_f8;
  undefined1 *local_f0;
  long local_e8;
  undefined1 local_e0 [16];
  string local_d0;
  vector<int,_std::allocator<int>_> *local_b0;
  undefined1 *local_a8;
  long local_a0;
  undefined1 local_98 [16];
  key_type local_88;
  subentry *local_68;
  ulong local_60;
  vector<fasttext::subentry,_std::allocator<fasttext::subentry>_> *local_58;
  vector<fasttext::subentry,_std::allocator<fasttext::subentry>_> *local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_68 = sublemma;
  local_58 = submorph;
  local_50 = subngram;
  utils::split(&local_48,word,'~');
  if (local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar19 = 0;
    local_b0 = ngrams;
    do {
      local_a8 = local_98;
      pcVar1 = local_48.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar19]._M_dataplus._M_p;
      local_60 = uVar19;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a8,pcVar1,
                 pcVar1 + local_48.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar19]._M_string_length);
      std::__cxx11::string::find((char)(string *)&local_a8,0x3a);
      std::__cxx11::string::substr((ulong)&local_88,(ulong)&local_a8);
      iVar6 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::find(&(((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->props)._M_h,&local_88);
      if (iVar6.
          super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          ._M_cur != (__node_type *)0x0) {
        iVar4 = std::__cxx11::string::compare((char *)&local_88);
        cVar13 = (char)&local_a8;
        if (iVar4 == 0) {
          std::__cxx11::string::find(cVar13,0x3a);
          std::__cxx11::string::substr((ulong)local_138,(ulong)&local_a8);
          plVar8 = (long *)std::__cxx11::string::replace
                                     ((ulong)local_138,0,(char *)0x0,BOW_abi_cxx11_);
          paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar8 == paVar10) {
            local_108._M_allocated_capacity = paVar10->_M_allocated_capacity;
            local_108._8_8_ = plVar8[3];
            local_118._M_allocated_capacity = (size_type)&local_108;
          }
          else {
            local_108._M_allocated_capacity = paVar10->_M_allocated_capacity;
            local_118._M_allocated_capacity =
                 (size_type)
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*plVar8;
          }
          local_118._8_8_ = plVar8[1];
          *plVar8 = (long)paVar10;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          plVar8 = (long *)std::__cxx11::string::_M_append(local_118._M_local_buf,EOW_abi_cxx11_);
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          psVar11 = (size_type *)(plVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_d0.field_2._M_allocated_capacity = *psVar11;
            local_d0.field_2._8_8_ = plVar8[3];
          }
          else {
            local_d0.field_2._M_allocated_capacity = *psVar11;
            local_d0._M_dataplus._M_p = (pointer)*plVar8;
          }
          local_d0._M_string_length = plVar8[1];
          *plVar8 = (long)psVar11;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_allocated_capacity != &local_108) {
            operator_delete((void *)local_118._M_allocated_capacity);
          }
          if ((pointer)local_138._0_8_ != (pointer)(local_138 + 0x10)) {
            operator_delete((void *)local_138._0_8_);
          }
          if (local_d0._M_string_length != 0) {
            uVar16 = 0;
            uVar19 = local_d0._M_string_length;
            do {
              local_138._0_8_ = local_138 + 0x10;
              local_138._8_8_ = (pointer)0x0;
              local_138._16_8_ = local_138._16_8_ & 0xffffffffffffff00;
              if (uVar16 < uVar19) {
                if (((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->maxn != 0) {
                  uVar15 = 1;
                  uVar18 = uVar16;
                  do {
                    std::__cxx11::string::push_back
                              ((char)(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)local_138);
                    uVar18 = uVar18 + 1;
                    peVar3 = (this->args_).
                             super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                    if ((ulong)(long)peVar3->minn <= uVar15) {
                      if ((uVar15 != 1) || (uVar16 != 0 && uVar18 != local_d0._M_string_length)) {
                        uVar5 = 0x811c9dc5;
                        if ((pointer)local_138._8_8_ != (pointer)0x0) {
                          pbVar9 = (pointer)0x0;
                          do {
                            uVar5 = ((int)*(char *)((long)&((_Alloc_hider *)local_138._0_8_)->_M_p +
                                                   (long)&(pbVar9->_M_dataplus)._M_p) ^ uVar5) *
                                    0x1000193;
                            pbVar9 = (pointer)((long)&(pbVar9->_M_dataplus)._M_p + 1);
                          } while ((pointer)local_138._8_8_ != pbVar9);
                        }
                        uVar5 = uVar5 % (uint)peVar3->bucket;
                        iVar4 = this->nwords_ + uVar5;
                        local_118._M_allocated_capacity._0_4_ = iVar4;
                        iVar2._M_current =
                             (local_b0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_finish;
                        if (iVar2._M_current ==
                            (local_b0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_end_of_storage) {
                          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                                    (local_b0,iVar2,(int *)local_118._M_local_buf);
                        }
                        else {
                          *iVar2._M_current = iVar4;
                          (local_b0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_finish = iVar2._M_current + 1;
                        }
                        local_118._M_allocated_capacity = (size_type)&local_108;
                        local_118._8_8_ = 0;
                        local_108._M_allocated_capacity =
                             local_108._M_allocated_capacity & 0xffffffffffffff00;
                        std::__cxx11::string::_M_assign((string *)local_118._M_local_buf);
                        local_f8 = (long)(int)uVar5 + (long)this->nwords_;
                        std::vector<fasttext::subentry,_std::allocator<fasttext::subentry>_>::
                        push_back(local_50,(value_type *)&local_118);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_118._M_allocated_capacity != &local_108) {
                          operator_delete((void *)local_118._M_allocated_capacity);
                        }
                      }
                    }
                    uVar19 = local_d0._M_string_length;
                  } while ((uVar18 < local_d0._M_string_length) &&
                          (uVar15 = uVar15 + 1,
                          uVar15 <= (ulong)(long)((this->args_).
                                                  super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>
                                                 ._M_ptr)->maxn));
                }
                if ((pointer)local_138._0_8_ != (pointer)(local_138 + 0x10)) {
                  operator_delete((void *)local_138._0_8_);
                  uVar19 = local_d0._M_string_length;
                }
              }
              uVar16 = uVar16 + 1;
            } while (uVar16 < uVar19);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p);
          }
        }
        else {
          std::__cxx11::string::find(cVar13,0x3a);
          std::__cxx11::string::substr((ulong)&local_d0,(ulong)&local_a8);
          iVar4 = std::__cxx11::string::compare((char *)&local_88);
          if (iVar4 == 0) {
            uVar5 = 0x811c9dc5;
            if (local_a0 != 0) {
              lVar12 = 0;
              do {
                uVar5 = ((int)(char)local_a8[lVar12] ^ uVar5) * 0x1000193;
                lVar12 = lVar12 + 1;
              } while (local_a0 != lVar12);
            }
            uVar5 = uVar5 % (uint)((this->args_).
                                   super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr)->bucket;
            local_68->id = (long)(int)uVar5 + (long)this->nwords_;
            std::__cxx11::string::_M_assign((string *)local_68);
            iVar4 = uVar5 + this->nwords_;
            local_118._M_allocated_capacity._0_4_ = iVar4;
            iVar2._M_current =
                 (local_b0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar2._M_current ==
                (local_b0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (local_b0,iVar2,(int *)local_118._M_local_buf);
            }
            else {
              *iVar2._M_current = iVar4;
              (local_b0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_finish = iVar2._M_current + 1;
            }
          }
          iVar4 = std::__cxx11::string::compare((char *)&local_88);
          if (iVar4 == 0) {
            utils::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_138,&local_d0,'+');
            if (local_138._8_8_ != local_138._0_8_) {
              uVar19 = 0;
              do {
                if (((pointer)(local_138._0_8_ + uVar19 * 0x20))->_M_string_length == 0) {
                  uVar5 = 0x811c9dc5;
                }
                else {
                  uVar5 = 0x811c9dc5;
                  sVar14 = 0;
                  do {
                    uVar5 = ((int)(((pointer)(local_138._0_8_ + uVar19 * 0x20))->_M_dataplus)._M_p
                                  [sVar14] ^ uVar5) * 0x1000193;
                    sVar14 = sVar14 + 1;
                  } while (((pointer)(local_138._0_8_ + uVar19 * 0x20))->_M_string_length != sVar14)
                  ;
                }
                uVar5 = uVar5 % (uint)((this->args_).
                                       super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->bucket;
                local_118._8_8_ = 0;
                local_108._M_allocated_capacity =
                     local_108._M_allocated_capacity & 0xffffffffffffff00;
                local_f8 = (long)(int)uVar5 + (long)this->nwords_;
                local_118._M_allocated_capacity = (size_type)&local_108;
                std::__cxx11::string::_M_assign((string *)local_118._M_local_buf);
                std::vector<fasttext::subentry,_std::allocator<fasttext::subentry>_>::push_back
                          (local_58,(value_type *)&local_118);
                iVar4 = uVar5 + this->nwords_;
                local_f0 = (undefined1 *)CONCAT44(local_f0._4_4_,iVar4);
                iVar2._M_current =
                     (local_b0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar2._M_current ==
                    (local_b0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                            (local_b0,iVar2,(int *)&local_f0);
                }
                else {
                  *iVar2._M_current = iVar4;
                  (local_b0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish = iVar2._M_current + 1;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_118._M_allocated_capacity != &local_108) {
                  operator_delete((void *)local_118._M_allocated_capacity);
                }
                uVar19 = uVar19 + 1;
              } while (uVar19 < (ulong)((long)(local_138._8_8_ - local_138._0_8_) >> 5));
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_138);
          }
          iVar4 = std::__cxx11::string::compare((char *)&local_88);
          if (iVar4 == 0) {
            std::__cxx11::string::find((char)&local_a8,0x3a);
            std::__cxx11::string::substr((ulong)&local_f0,(ulong)&local_a8);
            puVar7 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,BOW_abi_cxx11_);
            paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar7 == paVar10) {
              local_108._M_allocated_capacity = paVar10->_M_allocated_capacity;
              local_108._8_8_ = puVar7[3];
              local_118._M_allocated_capacity = (size_type)&local_108;
            }
            else {
              local_108._M_allocated_capacity = paVar10->_M_allocated_capacity;
              local_118._M_allocated_capacity =
                   (size_type)
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar7;
            }
            local_118._8_8_ = puVar7[1];
            *puVar7 = paVar10;
            puVar7[1] = 0;
            *(undefined1 *)(puVar7 + 2) = 0;
            plVar8 = (long *)std::__cxx11::string::_M_append(local_118._M_local_buf,EOW_abi_cxx11_);
            pbVar9 = (pointer)(plVar8 + 2);
            if ((pointer)*plVar8 == pbVar9) {
              local_138._16_8_ = (pbVar9->_M_dataplus)._M_p;
              lStack_120 = plVar8[3];
              local_138._0_8_ = (pointer)(local_138 + 0x10);
            }
            else {
              local_138._16_8_ = (pbVar9->_M_dataplus)._M_p;
              local_138._0_8_ = (pointer)*plVar8;
            }
            local_138._8_8_ = plVar8[1];
            *plVar8 = (long)pbVar9;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_allocated_capacity != &local_108) {
              operator_delete((void *)local_118._M_allocated_capacity);
            }
            if (local_f0 != local_e0) {
              operator_delete(local_f0);
            }
            if ((pointer)local_138._8_8_ != (pointer)0x0) {
              pbVar20 = (pointer)0x0;
              pbVar9 = (pointer)local_138._8_8_;
              do {
                local_f0 = local_e0;
                local_e8 = 0;
                local_e0[0] = 0;
                if (pbVar20 < pbVar9) {
                  if (((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->maxn != 0) {
                    uVar19 = 1;
                    pbVar17 = pbVar20;
                    do {
                      std::__cxx11::string::push_back((char)&local_f0);
                      pbVar17 = (pointer)((long)&(pbVar17->_M_dataplus)._M_p + 1);
                      peVar3 = (this->args_).
                               super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      ;
                      if ((ulong)(long)peVar3->minn <= uVar19) {
                        if ((uVar19 != 1) ||
                           (pbVar20 != (pointer)0x0 && pbVar17 != (pointer)local_138._8_8_)) {
                          uVar5 = 0x811c9dc5;
                          if (local_e8 != 0) {
                            lVar12 = 0;
                            do {
                              uVar5 = ((int)(char)local_f0[lVar12] ^ uVar5) * 0x1000193;
                              lVar12 = lVar12 + 1;
                            } while (local_e8 != lVar12);
                          }
                          uVar5 = uVar5 % (uint)peVar3->bucket;
                          iVar4 = this->nwords_ + uVar5;
                          local_118._M_allocated_capacity._0_4_ = iVar4;
                          iVar2._M_current =
                               (local_b0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_finish;
                          if (iVar2._M_current ==
                              (local_b0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_end_of_storage) {
                            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                                      (local_b0,iVar2,(int *)local_118._M_local_buf);
                          }
                          else {
                            *iVar2._M_current = iVar4;
                            (local_b0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish = iVar2._M_current + 1;
                          }
                          local_118._M_allocated_capacity = (size_type)&local_108;
                          local_118._8_8_ = 0;
                          local_108._M_allocated_capacity =
                               local_108._M_allocated_capacity & 0xffffffffffffff00;
                          std::__cxx11::string::_M_assign((string *)local_118._M_local_buf);
                          local_f8 = (long)(int)uVar5 + (long)this->nwords_;
                          std::vector<fasttext::subentry,_std::allocator<fasttext::subentry>_>::
                          push_back(subipangram,(value_type *)&local_118);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_118._M_allocated_capacity != &local_108) {
                            operator_delete((void *)local_118._M_allocated_capacity);
                          }
                        }
                      }
                      pbVar9 = (pointer)local_138._8_8_;
                    } while ((pbVar17 < (ulong)local_138._8_8_) &&
                            (uVar19 = uVar19 + 1,
                            uVar19 <= (ulong)(long)((this->args_).
                                                                                                        
                                                  super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->maxn));
                  }
                  if (local_f0 != local_e0) {
                    operator_delete(local_f0);
                    pbVar9 = (pointer)local_138._8_8_;
                  }
                }
                pbVar20 = (pointer)((long)&(pbVar20->_M_dataplus)._M_p + 1);
              } while (pbVar20 < pbVar9);
            }
            if ((pointer)local_138._0_8_ != (pointer)(local_138 + 0x10)) {
              operator_delete((void *)local_138._0_8_);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p);
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p);
      }
      if (local_a8 != local_98) {
        operator_delete(local_a8);
      }
      uVar19 = local_60 + 1;
    } while (uVar19 < (ulong)((long)local_48.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_48.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void Dictionary::computeNgrams(const std::string& word,
                               std::vector<int32_t>& ngrams,
			      std::vector<subentry>& subngram,
	                      subentry& sublemma,
                              std::vector<subentry>& submorph,
			      std::vector<subentry>& subipangram) const {
  //char x;
  std::vector<std::string> propsValues = utils::split(word, '~');
  for (size_t i = 0; i < propsValues.size(); i++) {
    std::string value = propsValues[i];
	std::string prop = value.substr(0, value.find(PROP_VALUE_SEP));
  const bool useProp = args_->props.find(prop) != args_->props.end();
	if (useProp) {
	   if(prop == "w"){

        // If only whole word  uncomment next two lines and comment rest code in the if loop
		/*int32_t h = hash(value) % args_->bucket;
		ngrams.push_back(nwords_ + h);*/

       // Default consider character-ngrams
	   std::string temp_word = BOW + value.substr(value.find(PROP_VALUE_SEP)+1,std::string::npos) + EOW;
	   for (size_t i = 0; i < temp_word.size(); i++) {
            std::string charn;
            if ((temp_word[i] & 0xC0) == 0x80) continue;
            for (size_t j = i, n = 1; j < temp_word.size() && n <= args_->maxn; n++) {
              charn.push_back(temp_word[j++]);
              while (j < temp_word.size() && (temp_word[j] & 0xC0) == 0x80) {
                charn.push_back(temp_word[j++]);
              }
              if (n >= args_->minn && !(n == 1 && (i == 0 || j == temp_word.size()))) {
                int32_t h = hash(charn) % args_->bucket;
                ngrams.push_back(nwords_ + h);
		        subentry e;
		        e.subword = charn;
		        e.id = nwords_+h;
		        subngram.push_back(e);
              }
            }
          }
	}
	else{
         std::string val = value.substr(value.find(PROP_VALUE_SEP)+1, std::string::npos);
         if(prop == "l"){
	  	    int32_t h = hash(value) % args_->bucket;
            sublemma.id = nwords_+h;
		    sublemma.subword = value;
	        ngrams.push_back(nwords_ + h);
	      }
	    if(prop == "m"){
            //Default encodes each morph tag separately
		    std::vector<std::string> morphValues = utils::split(val, '+');

		    for(int32_t m=0;m<morphValues.size();m++){
			    int32_t h = hash( morphValues[m]) % args_->bucket;
			    subentry e;
			    e.id = nwords_+h;
			    e.subword =  morphValues[m];
			    submorph.push_back(e);
	   		    ngrams.push_back(nwords_ + h);
		    }

          //Encodes the morphology tags as a whole
		  /*subentry e;
		  std::string val = value.substr(value.find(PROP_VALUE_SEP)+1,std::string::npos);
		  if(value=="")
		  { value = "m:<unk>";}
		  int32_t h = hash(value) % args_->bucket;
		  e.id = nwords_+h;
		  e.subword = value;
		  submorph.push_back(e);
		  ngrams.push_back(nwords_+h);*/
	    }

        if(prop == "ipa"){
	
	      std::string temp_word = BOW + value.substr(value.find(PROP_VALUE_SEP)+1,std::string::npos) + EOW;
	      for (size_t i = 0; i < temp_word.size(); i++) {
                std::string charn;
                if ((temp_word[i] & 0xC0) == 0x80) continue;
                for (size_t j = i, n = 1; j < temp_word.size() && n <= args_->maxn; n++) {
                    charn.push_back(temp_word[j++]);
                    while (j < temp_word.size() && (temp_word[j] & 0xC0) == 0x80) {
                    charn.push_back(temp_word[j++]);
                 }
              if (n >= args_->minn && !(n == 1 && (i == 0 || j == temp_word.size()))) {
                int32_t h = hash(charn) % args_->bucket;
                ngrams.push_back(nwords_ + h);
		        subentry e;
		        e.subword = charn;
		        e.id = nwords_+h;
		        subipangram.push_back(e);
              }
            }
          }
	    }
	  }
	}
  }
}